

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOFileData.h
# Opt level: O0

void __thiscall Assimp::LWO::Layer::~Layer(Layer *this)

{
  Layer *this_local;
  
  std::__cxx11::string::~string((string *)&this->mName);
  std::vector<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>::~vector(&this->mFaces);
  NormalChannel::~NormalChannel(&this->mNormals);
  std::vector<Assimp::LWO::UVChannel,_std::allocator<Assimp::LWO::UVChannel>_>::~vector
            (&this->mUVChannels);
  std::vector<Assimp::LWO::VColorChannel,_std::allocator<Assimp::LWO::VColorChannel>_>::~vector
            (&this->mVColorChannels);
  std::vector<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>::~vector
            (&this->mSWeightChannels);
  std::vector<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>::~vector
            (&this->mWeightChannels);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&this->mPointReferrers);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~vector(&this->mTempPoints);
  return;
}

Assistant:

Layer()
        : mFaceIDXOfs   (0)
        , mPointIDXOfs  (0)
        , mParent       (0x0)
        , mIndex        (0xffff)
        , skip          (false)
    {}